

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
ScanNewImplicitRoots
          (HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *this,
          Recycler *recycler)

{
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::ScanNewImplicitRoots(Memory::Recycler*)::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (this->fullBlockList,(anon_class_8_1_b8cf05bd)recycler);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::ScanNewImplicitRoots(Memory::Recycler*)::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_2_>
            (this->heapBlockList,(anon_class_8_1_b8cf05bd)recycler);
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::ScanNewImplicitRoots(Recycler * recycler)
{
    HeapBlockList::ForEach(fullBlockList, [recycler](TBlockType * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && !this->IsAnyFinalizableBucket())
    {
        HeapBlockList::ForEach(sweepableHeapBlockList, [recycler](TBlockType * heapBlock)
        {
            heapBlock->ScanNewImplicitRoots(recycler);
        });
    }
#endif

    HeapBlockList::ForEach(heapBlockList, [recycler](TBlockType * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
}